

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O0

void __thiscall
ParseTableCalculation::closeItemSet
          (ParseTableCalculation *this,
          set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
          *set)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int rule_index_00;
  bool bVar1;
  ulong uVar2;
  const_iterator __last;
  pointer ppVar3;
  reference piVar4;
  size_type sVar5;
  _Self local_1b8;
  _Self local_1b0;
  undefined1 local_1a8 [8];
  Item item_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *token;
  iterator __end4;
  iterator __begin4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  iterator iStack_158;
  int rule_index;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_set;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  after_non_terminal_tokens;
  value_type *rule;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
  local_c0;
  iterator found;
  undefined1 local_b0 [8];
  string right_of_dot;
  Item *item;
  iterator __end2;
  iterator __begin2;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *__range2;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> added_items;
  allocator<ParseTableCalculation::Item> local_41;
  _Rb_tree_const_iterator<ParseTableCalculation::Item> local_40;
  _Rb_tree_const_iterator<ParseTableCalculation::Item> local_38;
  undefined1 local_30 [8];
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> items;
  set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
  *set_local;
  ParseTableCalculation *this_local;
  
  items.
  super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)set;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
       ::begin(set);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
       ::end((set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
              *)items.
                super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<ParseTableCalculation::Item>::allocator(&local_41);
  std::vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>>::
  vector<std::_Rb_tree_const_iterator<ParseTableCalculation::Item>,void>
            ((vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>> *)
             local_30,local_38,local_40,&local_41);
  std::allocator<ParseTableCalculation::Item>::~allocator(&local_41);
  do {
    std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::vector
              ((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *)
               &__range2);
    __end2 = std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
             ::begin((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                      *)local_30);
    item = (Item *)std::
                   vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                   ::end((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                          *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<ParseTableCalculation::Item_*,_std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>_>
                                       *)&item), bVar1) {
      right_of_dot.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<ParseTableCalculation::Item_*,_std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>_>
           ::operator*(&__end2);
      rightOfDot_abi_cxx11_((string *)local_b0,this,(Item *)right_of_dot.field_2._8_8_);
      uVar2 = std::__cxx11::string::empty();
      if (((uVar2 & 1) != 0) || (bVar1 = isTerminal((string *)local_b0), bVar1)) {
        found.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
        ._M_cur._4_4_ = 5;
      }
      else {
        local_c0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::find(&this->non_terminal_to_rule_indices_,(key_type *)local_b0);
        rule = (value_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::end(&this->non_terminal_to_rule_indices_);
        bVar1 = std::__detail::operator!=
                          (&local_c0,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
                            *)&rule);
        if (!bVar1) {
          __assert_fail("found != non_terminal_to_rule_indices_.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                        ,0x52,"void ParseTableCalculation::closeItemSet(std::set<Item> &)");
        }
        after_non_terminal_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&this->rules_,(long)*(int *)right_of_dot.field_2._8_8_);
        local_100._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)after_non_terminal_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_f8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator+(&local_100,(long)*(int *)(right_of_dot.field_2._8_8_ + 4));
        local_f0 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator+(&local_f8,1);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)after_non_terminal_tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&first_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(this_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e8,
                   local_f0,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__last._M_current,this_00);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&first_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8,(value_type *)(right_of_dot.field_2._8_8_ + 8));
        getFirstSet((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3,this,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_false,_true>
                               *)&local_c0);
        __end3 = std::vector<int,_std::allocator<int>_>::begin(&ppVar3->second);
        iStack_158 = std::vector<int,_std::allocator<int>_>::end(&ppVar3->second);
        while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffea8), bVar1) {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3);
          rule_index_00 = *piVar4;
          sVar5 = std::
                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::size(&this->rules_);
          if ((int)sVar5 <= rule_index_00) {
            __assert_fail("rule_index < static_cast<int>(rules_.size())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                          ,0x59,"void ParseTableCalculation::closeItemSet(std::set<Item> &)");
          }
          __end4 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range3);
          token = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
          while (bVar1 = std::operator!=(&__end4,(_Self *)&token), bVar1) {
            item_1.lookahead.field_2._8_8_ =
                 std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end4);
            Item::Item((Item *)local_1a8,rule_index_00,1,(string *)item_1.lookahead.field_2._8_8_);
            local_1b0._M_node =
                 (_Base_ptr)
                 std::
                 set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                 ::find((set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                         *)items.
                           super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_1a8)
            ;
            local_1b8._M_node =
                 (_Base_ptr)
                 std::
                 set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                 ::end((set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                        *)items.
                          super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar1 = std::operator==(&local_1b0,&local_1b8);
            if (bVar1) {
              std::
              set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
              ::insert((set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                        *)items.
                          super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1a8
                      );
              std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
              ::push_back((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                           *)&__range2,(value_type *)local_1a8);
            }
            Item::~Item((Item *)local_1a8);
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end4);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e8);
        found.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
        ._M_cur._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_b0);
      __gnu_cxx::
      __normal_iterator<ParseTableCalculation::Item_*,_std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>_>
      ::operator++(&__end2);
    }
    bVar1 = std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
            empty((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                   *)&__range2);
    if (!bVar1) {
      std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
      operator=((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *
                )local_30,
                (vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *
                )&__range2);
    }
    found.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
    ._M_cur._5_3_ = 0;
    found.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
    ._M_cur._4_1_ = bVar1;
    std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::~vector
              ((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *)
               &__range2);
  } while (found.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
           ._M_cur._4_4_ == 0);
  std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::~vector
            ((vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> *)
             local_30);
  return;
}

Assistant:

void ParseTableCalculation::closeItemSet(std::set<Item>& set)
{
	std::vector<Item> items(set.begin(), set.end());
	for (;;)
	{
		std::vector<Item> added_items;
		for (const Item& item : items)
		{
			std::string right_of_dot = rightOfDot(item);
			if (right_of_dot.empty() || isTerminal(right_of_dot))
			{
				continue;
			}
			auto found = non_terminal_to_rule_indices_.find(right_of_dot);
			assert(found != non_terminal_to_rule_indices_.end());
			const auto& rule = rules_[item.ruleIndex];
			std::vector<std::string> after_non_terminal_tokens(rule.begin() + item.dotPosition + 1, rule.end());
			after_non_terminal_tokens.push_back(item.lookahead);
			auto first_set = getFirstSet(after_non_terminal_tokens);
			for (int rule_index : found->second)
			{
				assert(rule_index < static_cast<int>(rules_.size()));
				for (const auto& token : first_set)
				{
					Item item(rule_index, 1, token);
					if (set.find(item) == set.end())
					{
						set.insert(item);
						added_items.push_back(item);
					}
				}
			}
		}
		if (added_items.empty())
		{
			return;
		}
		items = added_items;
	}
}